

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

mainchan *
mainchan_new(PacketProtocolLayer *ppl,ConnectionLayer *cl,Conf *conf,int term_width,int term_height,
            _Bool is_simple,SshChannel **sc_out)

{
  _Bool _Var1;
  int port_00;
  BinaryPacketProtocol *pBVar2;
  char *pcVar3;
  PacketProtocolLayerVtable *pPVar4;
  int port;
  char *host;
  mainchan *mc;
  _Bool is_simple_local;
  int term_height_local;
  int term_width_local;
  Conf *conf_local;
  ConnectionLayer *cl_local;
  PacketProtocolLayer *ppl_local;
  
  _Var1 = conf_get_bool(conf,0x32);
  if (_Var1) {
    ppl_local = (PacketProtocolLayer *)0x0;
  }
  else {
    ppl_local = (PacketProtocolLayer *)safemalloc(1,0x58,0);
    memset(ppl_local,0,0x58);
    ppl_local->in_pq = (PktInQueue *)ppl;
    ppl_local->out_pq = (PktOutQueue *)cl;
    pBVar2 = (BinaryPacketProtocol *)conf_copy(conf);
    ppl_local->bpp = pBVar2;
    *(int *)((long)&ppl_local->selfptr + 4) = term_width;
    *(int *)&ppl_local->logctx = term_height;
    *(_Bool *)((long)&(ppl_local->ic_process_queue).fn + 4) = is_simple;
    ppl_local->vt = (PacketProtocolLayerVtable *)0x0;
    ppl_local->seat = (Seat *)&mainchan_channelvt;
    *(undefined4 *)&ppl_local->interactor = 0;
    pcVar3 = conf_get_str((Conf *)ppl_local->bpp,0x33);
    if (*pcVar3 == '\0') {
      pPVar4 = (PacketProtocolLayerVtable *)ssh_session_open(cl,(Channel *)&ppl_local->seat);
      ppl_local->vt = pPVar4;
      *(undefined4 *)&(ppl_local->ic_process_queue).fn = 0;
    }
    else {
      pcVar3 = conf_get_str((Conf *)ppl_local->bpp,0x33);
      port_00 = conf_get_int((Conf *)ppl_local->bpp,0x34);
      pPVar4 = (PacketProtocolLayerVtable *)
               ssh_lportfwd_open(cl,pcVar3,port_00,"main channel",(SocketPeerInfo *)0x0,
                                 (Channel *)&ppl_local->seat);
      ppl_local->vt = pPVar4;
      *(undefined4 *)&(ppl_local->ic_process_queue).fn = 1;
    }
    if (sc_out != (SshChannel **)0x0) {
      *sc_out = (SshChannel *)ppl_local->vt;
    }
  }
  return (mainchan *)ppl_local;
}

Assistant:

mainchan *mainchan_new(
    PacketProtocolLayer *ppl, ConnectionLayer *cl, Conf *conf,
    int term_width, int term_height, bool is_simple, SshChannel **sc_out)
{
    mainchan *mc;

    if (conf_get_bool(conf, CONF_ssh_no_shell))
        return NULL;                   /* no main channel at all */

    mc = snew(mainchan);
    memset(mc, 0, sizeof(mainchan));
    mc->ppl = ppl;
    mc->cl = cl;
    mc->conf = conf_copy(conf);
    mc->term_width = term_width;
    mc->term_height = term_height;
    mc->is_simple = is_simple;

    mc->sc = NULL;
    mc->chan.vt = &mainchan_channelvt;
    mc->chan.initial_fixed_window_size = 0;

    if (*conf_get_str(mc->conf, CONF_ssh_nc_host)) {
        const char *host = conf_get_str(mc->conf, CONF_ssh_nc_host);
        int port = conf_get_int(mc->conf, CONF_ssh_nc_port);

        mc->sc = ssh_lportfwd_open(cl, host, port, "main channel",
                                   NULL, &mc->chan);
        mc->type = MAINCHAN_DIRECT_TCPIP;
    } else {
        mc->sc = ssh_session_open(cl, &mc->chan);
        mc->type = MAINCHAN_SESSION;
    }

    if (sc_out) *sc_out = mc->sc;
    return mc;
}